

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

int dumb_it_scan_for_playable_orders
              (DUMB_IT_SIGDATA *sigdata,dumb_scan_callback callback,void *callback_data)

{
  IT_CALLBACKS *pIVar1;
  int iVar2;
  int32 iVar3;
  void *array;
  DUMB_IT_SIGRENDERER *vsigrenderer;
  int iVar4;
  size_t sVar5;
  long lVar6;
  
  if ((((long)sigdata->n_orders == 0) || (sigdata->order == (uchar *)0x0)) ||
     (array = bit_array_create((long)sigdata->n_orders << 8), array == (void *)0x0)) {
    return -1;
  }
  if (1 < sigdata->n_orders) {
    lVar6 = 1;
    sVar5 = 0x100;
    do {
      if ((sigdata->n_patterns <= (int)(uint)sigdata->order[lVar6]) ||
         (iVar2 = is_pattern_silent(sigdata->pattern + sigdata->order[lVar6],(int)lVar6), 1 < iVar2)
         ) {
        bit_array_set(array,sVar5);
      }
      lVar6 = lVar6 + 1;
      sVar5 = sVar5 + 0x100;
    } while (lVar6 < sigdata->n_orders);
  }
  do {
    lVar6 = 0;
    if (0 < sigdata->n_orders) {
      sVar5 = 0;
      lVar6 = 0;
      do {
        iVar2 = bit_array_test_range(array,sVar5,0x100);
        if (iVar2 == 0) break;
        lVar6 = lVar6 + 1;
        sVar5 = sVar5 + 0x100;
      } while (lVar6 < sigdata->n_orders);
    }
    iVar2 = (int)lVar6;
    if (iVar2 == sigdata->n_orders) {
      iVar2 = 0;
LAB_005b1bc4:
      bit_array_destroy(array);
      return iVar2;
    }
    vsigrenderer = dumb_it_init_sigrenderer(sigdata,0,iVar2);
    if (vsigrenderer == (DUMB_IT_SIGRENDERER *)0x0) {
      iVar2 = -1;
      goto LAB_005b1bc4;
    }
    pIVar1 = vsigrenderer->callbacks;
    pIVar1->loop = dumb_it_callback_terminate;
    pIVar1->xm_speed_zero = dumb_it_callback_terminate;
    pIVar1->global_volume_zero = dumb_it_callback_terminate;
    iVar4 = 0;
    do {
      iVar3 = it_sigrenderer_get_samples(vsigrenderer,0.0,1.0,0x1e0000,(sample_t_conflict **)0x0);
      iVar4 = iVar4 + iVar3;
      if (iVar3 < 0x1e0000) break;
    } while (iVar4 < 0x1c200000);
    iVar2 = (*callback)(callback_data,iVar2,iVar4);
    if (iVar2 < 0) {
      return -1;
    }
    bit_array_merge(array,vsigrenderer->played,0);
    _dumb_it_end_sigrenderer(vsigrenderer);
  } while( true );
}

Assistant:

int DUMBEXPORT dumb_it_scan_for_playable_orders(DUMB_IT_SIGDATA *sigdata, dumb_scan_callback callback, void * callback_data)
{
	int n;
	int32 length;
	void * ba_played;
	DUMB_IT_SIGRENDERER * sigrenderer;
	
	if (!sigdata->n_orders || !sigdata->order) return -1;

	ba_played = bit_array_create(sigdata->n_orders * 256);
	if (!ba_played) return -1;

	/* Skip the first order, it should always be played */
	for (n = 1; n < sigdata->n_orders; n++) {
		if ((sigdata->order[n] >= sigdata->n_patterns) ||
			(is_pattern_silent(&sigdata->pattern[sigdata->order[n]], n) > 1))
			bit_array_set(ba_played, n * 256);
	}

	for (;;) {
		for (n = 0; n < sigdata->n_orders; n++) {
			if (!bit_array_test_range(ba_played, n * 256, 256)) break;
		}

		if (n == sigdata->n_orders) break;

		sigrenderer = dumb_it_init_sigrenderer(sigdata, 0, n);
		if (!sigrenderer) {
			bit_array_destroy(ba_played);
			return -1;
		}
		sigrenderer->callbacks->loop = &dumb_it_callback_terminate;
		sigrenderer->callbacks->xm_speed_zero = &dumb_it_callback_terminate;
		sigrenderer->callbacks->global_volume_zero = &dumb_it_callback_terminate;

		length = 0;

		for (;;) {
			int32 l;

			l = it_sigrenderer_get_samples(sigrenderer, 0, 1.0f, IT_CHECKPOINT_INTERVAL, NULL);
			length += l;
			if (l < IT_CHECKPOINT_INTERVAL || length >= FUCKIT_THRESHOLD) {
				/* SONG OVA! */
				break;
			}
		}

		if ((*callback)(callback_data, n, length) < 0) return -1;

		bit_array_merge(ba_played, sigrenderer->played, 0);

		_dumb_it_end_sigrenderer(sigrenderer);
	}

	bit_array_destroy(ba_played);

	return 0;
}